

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O2

ssh_key * ppk_load_s_wrapper(BinarySource *src,char **comment,char *passphrase,char **errorstr)

{
  ssh_key *psVar1;
  ssh2_userkey *ptr;
  
  ptr = ppk_load_s(src,passphrase,errorstr);
  if (ptr == &ssh2_wrong_passphrase) {
    *errorstr = "SSH2_WRONG_PASSPHRASE";
  }
  else if (ptr != (ssh2_userkey *)0x0) {
    psVar1 = ptr->key;
    *comment = ptr->comment;
    safefree(ptr);
    return psVar1;
  }
  return (ssh_key *)0x0;
}

Assistant:

ssh_key *ppk_load_s_wrapper(BinarySource *src, char **comment,
                            const char *passphrase, const char **errorstr)
{
    ssh2_userkey *uk = ppk_load_s(src, passphrase, errorstr);
    if (uk == SSH2_WRONG_PASSPHRASE) {
        /* Fudge this special return value */
        *errorstr = "SSH2_WRONG_PASSPHRASE";
        return NULL;
    }
    if (uk == NULL)
        return NULL;
    ssh_key *toret = uk->key;
    *comment = uk->comment;
    sfree(uk);
    return toret;
}